

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O2

bool __thiscall duckdb::Iterator::Next(Iterator *this)

{
  _Elt_pointer pIVar1;
  _Elt_pointer pIVar2;
  unsafe_optional_ptr<Node> node;
  _Elt_pointer pIVar3;
  uint8_t *byte;
  
  do {
    pIVar1 = (this->nodes).c.
             super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    pIVar2 = (this->nodes).c.
             super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pIVar2 == pIVar1) {
LAB_01a1a11a:
      return pIVar2 != pIVar1;
    }
    pIVar3 = pIVar2;
    if (pIVar2 == (this->nodes).c.
                  super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      pIVar3 = (this->nodes).c.
               super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (((pIVar3[-1].node.super_IndexPointer.data & 0x7f00000000000000) != 0x100000000000000) &&
       (pIVar3[-1].byte != 0xff)) {
      byte = &pIVar3[-1].byte;
      *byte = pIVar3[-1].byte + '\x01';
      node = GetNextChildInternal<duckdb::Node_const>(this->art,&pIVar3[-1].node,byte);
      if (node.ptr != (Node *)0x0) {
        IteratorKey::Pop(&this->current_key,1);
        IteratorKey::Push(&this->current_key,*byte);
        if (this->status == GATE_SET) {
          this->row_id[(ulong)this->nested_depth - 1] = *byte;
        }
        FindMinimum(this,node.ptr);
        goto LAB_01a1a11a;
      }
    }
    PopNode(this);
  } while( true );
}

Assistant:

bool Iterator::Next() {
	while (!nodes.empty()) {
		auto &top = nodes.top();
		D_ASSERT(!top.node.IsAnyLeaf());

		if (top.node.GetType() == NType::PREFIX) {
			PopNode();
			continue;
		}

		if (top.byte == NumericLimits<uint8_t>::Maximum()) {
			// No more children of this node.
			// Move up the tree by popping the key byte of the current node.
			PopNode();
			continue;
		}

		top.byte++;
		auto next_node = top.node.GetNextChild(art, top.byte);
		if (!next_node) {
			// No more children of this node.
			// Move up the tree by popping the key byte of the current node.
			PopNode();
			continue;
		}

		current_key.Pop(1);
		current_key.Push(top.byte);
		if (status == GateStatus::GATE_SET) {
			row_id[nested_depth - 1] = top.byte;
		}

		FindMinimum(*next_node);
		return true;
	}
	return false;
}